

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_proxy.c
# Opt level: O0

CURLcode CONNECT(connectdata *conn,int sockindex,char *hostname,int remote_port)

{
  _Bool _Var1;
  CHUNKcode CVar2;
  int iVar3;
  CURLcode CVar4;
  char *pcVar5;
  char *pcVar6;
  bool bVar7;
  time_t local_138;
  char *local_128;
  char *local_118;
  char *auth;
  int iStack_e4;
  _Bool proxy;
  CHUNKcode r_1;
  int writetype;
  ssize_t tookcareof;
  char *pcStack_d0;
  CHUNKcode r;
  char *line_start;
  char *ptr;
  ssize_t gotbytes;
  int keepon;
  int perline;
  size_t nread;
  char *hostheader;
  char *pcStack_98;
  _Bool ipv6_ip;
  char *http;
  char *useragent;
  char *proxyconn;
  char *host;
  Curl_send_buffer *req_buffer;
  char *host_port;
  time_t tStack_60;
  int error;
  time_t check;
  _Bool chunked_encoding;
  long lStack_50;
  _Bool closeConnection;
  curl_off_t cl;
  curl_socket_t tunnelsocket;
  CURLcode result;
  SingleRequest *k;
  Curl_easy *data;
  int subversion;
  int remote_port_local;
  char *hostname_local;
  connectdata *pcStack_18;
  int sockindex_local;
  connectdata *conn_local;
  
  data._0_4_ = 0;
  k = (SingleRequest *)conn->data;
  _tunnelsocket = &((Curl_easy *)k)->req;
  cl._0_4_ = conn->sock[sockindex];
  lStack_50 = 0;
  check._7_1_ = 0;
  check._6_1_ = 0;
  host_port._4_4_ = 0;
  if (conn->tunnel_state[sockindex] == TUNNEL_COMPLETE) {
    conn_local._4_4_ = CURLE_OK;
  }
  else {
    (conn->bits).proxy_connect_closed = false;
    data._4_4_ = remote_port;
    _subversion = hostname;
    hostname_local._4_4_ = sockindex;
    pcStack_18 = conn;
    do {
      if (pcStack_18->tunnel_state[hostname_local._4_4_] == TUNNEL_INIT) {
        Curl_infof((Curl_easy *)k,"Establish HTTP proxy tunnel to %s:%hu\n",_subversion,
                   (ulong)data._4_4_);
        (*Curl_cfree)(k[1].p);
        k[1].p = (char *)0x0;
        host = (char *)Curl_add_buffer_init();
        if ((Curl_send_buffer *)host == (Curl_send_buffer *)0x0) {
          return CURLE_OUT_OF_MEMORY;
        }
        req_buffer = (Curl_send_buffer *)curl_maprintf("%s:%hu",_subversion,(ulong)data._4_4_);
        if (req_buffer == (Curl_send_buffer *)0x0) {
          Curl_add_buffer_free((Curl_send_buffer *)host);
          return CURLE_OUT_OF_MEMORY;
        }
        cl._4_4_ = Curl_http_output_auth(pcStack_18,"CONNECT",(char *)req_buffer,true);
        (*Curl_cfree)(req_buffer);
        if (cl._4_4_ == CURLE_OK) {
          proxyconn = (char *)0x0;
          useragent = "";
          http = "";
          pcStack_98 = "1.1";
          if ((pcStack_18->http_proxy).proxytype == CURLPROXY_HTTP_1_0) {
            pcStack_98 = "1.0";
          }
          hostheader._7_1_ = (pcStack_18->bits).ipv6_ip & 1;
          if (_subversion != (pcStack_18->host).name) {
            pcVar5 = strchr(_subversion,0x3a);
            hostheader._7_1_ = pcVar5 != (char *)0x0;
          }
          pcVar5 = "";
          if ((bool)hostheader._7_1_ != false) {
            pcVar5 = "[";
          }
          pcVar6 = "";
          if ((bool)hostheader._7_1_ != false) {
            pcVar6 = "]";
          }
          nread = (size_t)curl_maprintf("%s%s%s:%hu",pcVar5,_subversion,pcVar6,(ulong)data._4_4_);
          if ((char *)nread == (char *)0x0) {
            Curl_add_buffer_free((Curl_send_buffer *)host);
            return CURLE_OUT_OF_MEMORY;
          }
          pcVar5 = Curl_checkProxyheaders(pcStack_18,"Host:");
          if ((pcVar5 == (char *)0x0) &&
             (proxyconn = curl_maprintf("Host: %s\r\n",nread), proxyconn == (char *)0x0)) {
            (*Curl_cfree)((void *)nread);
            Curl_add_buffer_free((Curl_send_buffer *)host);
            return CURLE_OUT_OF_MEMORY;
          }
          pcVar5 = Curl_checkProxyheaders(pcStack_18,"Proxy-Connection:");
          if (pcVar5 == (char *)0x0) {
            useragent = "Proxy-Connection: Keep-Alive\r\n";
          }
          pcVar5 = Curl_checkProxyheaders(pcStack_18,"User-Agent:");
          if ((pcVar5 == (char *)0x0) && (k[6].writebytecount != 0)) {
            http = (pcStack_18->allocptr).uagent;
          }
          if (proxyconn == (char *)0x0) {
            local_118 = "";
          }
          else {
            local_118 = proxyconn;
          }
          if ((pcStack_18->allocptr).proxyuserpwd == (char *)0x0) {
            local_128 = "";
          }
          else {
            local_128 = (pcStack_18->allocptr).proxyuserpwd;
          }
          cl._4_4_ = Curl_add_bufferf((Curl_send_buffer *)host,"CONNECT %s HTTP/%s\r\n%s%s%s%s",
                                      nread,pcStack_98,local_118,local_128,http,useragent);
          if (proxyconn != (char *)0x0) {
            (*Curl_cfree)(proxyconn);
          }
          (*Curl_cfree)((void *)nread);
          if (cl._4_4_ == CURLE_OK) {
            cl._4_4_ = Curl_add_custom_headers(pcStack_18,true,(Curl_send_buffer *)host);
          }
          if (cl._4_4_ == CURLE_OK) {
            cl._4_4_ = Curl_add_bufferf((Curl_send_buffer *)host,"\r\n");
          }
          if (cl._4_4_ == CURLE_OK) {
            cl._4_4_ = Curl_add_buffer_send
                                 ((Curl_send_buffer *)host,pcStack_18,(long *)&k[0x42].protop,0,
                                  hostname_local._4_4_);
          }
          host = (char *)0x0;
          if (cl._4_4_ != CURLE_OK) {
            Curl_failf((Curl_easy *)k,"Failed sending CONNECT to proxy");
          }
        }
        Curl_add_buffer_free((Curl_send_buffer *)host);
        if (cl._4_4_ != CURLE_OK) {
          return cl._4_4_;
        }
        pcStack_18->tunnel_state[hostname_local._4_4_] = TUNNEL_CONNECT;
      }
      tStack_60 = Curl_timeleft((Curl_easy *)k,(timeval *)0x0,true);
      if (tStack_60 < 1) {
        Curl_failf((Curl_easy *)k,"Proxy CONNECT aborted due to timeout");
        return CURLE_RECV_ERROR;
      }
      _Var1 = Curl_conn_data_pending(pcStack_18,hostname_local._4_4_);
      if (!_Var1) {
        return CURLE_OK;
      }
      gotbytes._0_4_ = 1;
      pcStack_d0 = pcStack_18->connect_buffer;
      _keepon = 0;
      gotbytes._4_4_ = 0;
      line_start = pcStack_d0;
      do {
        while( true ) {
          bVar7 = false;
          if ((_keepon < 0x4000) && (bVar7 = false, (int)gotbytes != 0)) {
            bVar7 = host_port._4_4_ == 0;
          }
          if (!bVar7) goto LAB_00b6a61c;
          iVar3 = Curl_pgrsUpdate(pcStack_18);
          if (iVar3 != 0) {
            return CURLE_ABORTED_BY_CALLBACK;
          }
          if (pcStack_18->connect_buffer + 0x4000 <= line_start) {
            Curl_failf((Curl_easy *)k,"CONNECT response too large!");
            return CURLE_RECV_ERROR;
          }
          tStack_60 = Curl_timeleft((Curl_easy *)k,(timeval *)0x0,true);
          if (tStack_60 < 1) {
            Curl_failf((Curl_easy *)k,"Proxy CONNECT aborted due to timeout");
            host_port._4_4_ = 2;
            goto LAB_00b6a61c;
          }
          cl._4_4_ = Curl_read(pcStack_18,(curl_socket_t)cl,line_start,1,(ssize_t *)&ptr);
          if (cl._4_4_ == CURLE_AGAIN) break;
          if (cl._4_4_ != CURLE_OK) {
            gotbytes._0_4_ = 0;
            goto LAB_00b6a61c;
          }
          if ((long)ptr < 1) {
            if ((k[1].upload_present == 0) || (k[0x40].bytecountp == (curl_off_t *)0x0)) {
              host_port._4_4_ = 1;
              Curl_failf((Curl_easy *)k,"Proxy CONNECT aborted");
            }
            else {
              (pcStack_18->bits).proxy_connect_closed = true;
              Curl_infof((Curl_easy *)k,"Proxy CONNECT connection closed\n");
            }
            gotbytes._0_4_ = 0;
            goto LAB_00b6a61c;
          }
          _keepon = _keepon + 1;
          if ((int)gotbytes < 2) {
            gotbytes._4_4_ = gotbytes._4_4_ + 1;
            if (*line_start == '\n') {
              cl._4_4_ = CURLE_OK;
              if ((k[4].chunk & 1U) != 0) {
                Curl_debug((Curl_easy *)k,CURLINFO_HEADER_IN,pcStack_d0,(long)gotbytes._4_4_,
                           pcStack_18);
              }
              if ((k[7].headerbytecount & 1) == 0) {
                iStack_e4 = 2;
                if ((k[4].upload_present & 0x10000000000) != 0) {
                  iStack_e4 = 3;
                }
                CVar4 = Curl_client_write(pcStack_18,iStack_e4,pcStack_d0,(long)gotbytes._4_4_);
                if (CVar4 != CURLE_OK) {
                  return CVar4;
                }
                cl._4_4_ = CURLE_OK;
              }
              *(long *)&k[0x42].chunk = (long)gotbytes._4_4_ + *(long *)&k[0x42].chunk;
              *(long *)&k->maxfd = (long)gotbytes._4_4_ + *(long *)&k->maxfd;
              if ((*pcStack_d0 == '\r') || (*pcStack_d0 == '\n')) {
                _keepon = 0;
                line_start = pcStack_18->connect_buffer;
                if ((_tunnelsocket->httpcode == 0x197) &&
                   (((ulong)k[0x40].writebytecountp & 1) == 0)) {
                  gotbytes._0_4_ = 2;
                  if (lStack_50 == 0) {
                    if ((check._6_1_ & 1) == 0) {
                      gotbytes._0_4_ = 0;
                    }
                    else {
                      Curl_infof((Curl_easy *)k,"Ignore chunked response-body\n");
                      _tunnelsocket->ignorebody = true;
                      if (pcStack_d0[1] == '\n') {
                        pcStack_d0 = pcStack_d0 + 1;
                      }
                      CVar2 = Curl_httpchunk_read(pcStack_18,pcStack_d0 + 1,1,(ssize_t *)&ptr);
                      if (CVar2 == CHUNKE_STOP) {
                        Curl_infof((Curl_easy *)k,"chunk reading DONE\n");
                        gotbytes._0_4_ = 0;
                        pcStack_18->tunnel_state[hostname_local._4_4_] = TUNNEL_COMPLETE;
                      }
                    }
                  }
                  else {
                    Curl_infof((Curl_easy *)k,"Ignore %ld bytes of response-body\n",lStack_50);
                  }
                }
                else {
                  gotbytes._0_4_ = 0;
                }
                pcStack_18->tunnel_state[hostname_local._4_4_] = TUNNEL_COMPLETE;
              }
              else {
                pcStack_d0[gotbytes._4_4_] = '\0';
                iVar3 = curl_strnequal("WWW-Authenticate:",pcStack_d0,0x11);
                if (((iVar3 == 0) || (_tunnelsocket->httpcode != 0x191)) &&
                   ((iVar3 = curl_strnequal("Proxy-authenticate:",pcStack_d0,0x13), iVar3 == 0 ||
                    (_tunnelsocket->httpcode != 0x197)))) {
                  iVar3 = curl_strnequal("Content-Length:",pcStack_d0,0xf);
                  if (iVar3 == 0) {
                    _Var1 = Curl_compareheader(pcStack_d0,"Connection:","close");
                    if (_Var1) {
                      check._7_1_ = 1;
                    }
                    else {
                      iVar3 = curl_strnequal("Transfer-Encoding:",pcStack_d0,0x12);
                      if (iVar3 == 0) {
                        _Var1 = Curl_compareheader(pcStack_d0,"Proxy-Connection:","close");
                        if (_Var1) {
                          check._7_1_ = 1;
                        }
                        else {
                          iVar3 = __isoc99_sscanf(pcStack_d0,"HTTP/1.%d %d",&data,
                                                  &_tunnelsocket->httpcode);
                          if (iVar3 == 2) {
                            *(int *)((long)&k[0x42].location + 4) = _tunnelsocket->httpcode;
                          }
                        }
                      }
                      else if (_tunnelsocket->httpcode / 100 == 2) {
                        Curl_infof((Curl_easy *)k,
                                   "Ignoring Transfer-Encoding in CONNECT %03d response\n",
                                   (ulong)(uint)_tunnelsocket->httpcode);
                      }
                      else {
                        _Var1 = Curl_compareheader(pcStack_d0,"Transfer-Encoding:","chunked");
                        if (_Var1) {
                          Curl_infof((Curl_easy *)k,"CONNECT responded chunked\n");
                          check._6_1_ = 1;
                          Curl_httpchunk_init(pcStack_18);
                        }
                      }
                    }
                  }
                  else if (_tunnelsocket->httpcode / 100 == 2) {
                    Curl_infof((Curl_easy *)k,"Ignoring Content-Length in CONNECT %03d response\n",
                               (ulong)(uint)_tunnelsocket->httpcode);
                  }
                  else {
                    lStack_50 = strtol(pcStack_d0 + 0xf,(char **)0x0,10);
                  }
                }
                else {
                  iVar3 = _tunnelsocket->httpcode;
                  pcVar5 = Curl_copy_header_value(pcStack_d0);
                  if (pcVar5 == (char *)0x0) {
                    return CURLE_OUT_OF_MEMORY;
                  }
                  cl._4_4_ = Curl_http_input_auth(pcStack_18,iVar3 == 0x197,pcVar5);
                  (*Curl_cfree)(pcVar5);
                  if (cl._4_4_ != CURLE_OK) {
                    return cl._4_4_;
                  }
                }
                gotbytes._4_4_ = 0;
                pcStack_d0 = pcStack_18->connect_buffer;
                line_start = pcStack_d0;
              }
            }
            else {
              line_start = line_start + 1;
            }
          }
          else {
            _keepon = 0;
            line_start = pcStack_18->connect_buffer;
            if (lStack_50 == 0) {
              _r_1 = 0;
              tookcareof._4_4_ = Curl_httpchunk_read(pcStack_18,line_start,1,(ssize_t *)&r_1);
              if (tookcareof._4_4_ == CHUNKE_STOP) {
                Curl_infof((Curl_easy *)k,"chunk reading DONE\n");
                gotbytes._0_4_ = 0;
                pcStack_18->tunnel_state[hostname_local._4_4_] = TUNNEL_COMPLETE;
              }
            }
            else {
              lStack_50 = lStack_50 + -1;
              if (lStack_50 < 1) {
                gotbytes._0_4_ = 0;
                goto LAB_00b6a61c;
              }
            }
          }
        }
        if (tStack_60 < 1000) {
          local_138 = tStack_60;
        }
        else {
          local_138 = 1000;
        }
        iVar3 = Curl_socket_check((curl_socket_t)cl,-1,-1,local_138);
      } while (iVar3 != -1);
      host_port._4_4_ = 1;
      Curl_failf((Curl_easy *)k,"Proxy CONNECT aborted due to select/poll error");
LAB_00b6a61c:
      iVar3 = Curl_pgrsUpdate(pcStack_18);
      if (iVar3 != 0) {
        return CURLE_ABORTED_BY_CALLBACK;
      }
      if (host_port._4_4_ != 0) {
        return CURLE_RECV_ERROR;
      }
      if (*(int *)((long)&k[0x42].location + 4) != 200) {
        CVar4 = Curl_http_auth_act(pcStack_18);
        if (CVar4 != CURLE_OK) {
          return CVar4;
        }
        if (((pcStack_18->bits).close & 1U) != 0) {
          check._7_1_ = 1;
        }
        cl._4_4_ = CURLE_OK;
      }
      if (((check._7_1_ & 1) != 0) && (k[1].p != (char *)0x0)) {
        Curl_closesocket(pcStack_18,pcStack_18->sock[hostname_local._4_4_]);
        pcStack_18->sock[hostname_local._4_4_] = -1;
        break;
      }
      if ((k[1].p != (char *)0x0) &&
         (pcStack_18->tunnel_state[hostname_local._4_4_] == TUNNEL_COMPLETE)) {
        pcStack_18->tunnel_state[hostname_local._4_4_] = TUNNEL_INIT;
        Curl_infof((Curl_easy *)k,"TUNNEL_STATE switched to: %d\n",
                   (ulong)pcStack_18->tunnel_state[hostname_local._4_4_]);
      }
    } while (k[1].p != (char *)0x0);
    if ((int)k[1].start.tv_sec == 200) {
      pcStack_18->tunnel_state[hostname_local._4_4_] = TUNNEL_COMPLETE;
      (*Curl_cfree)((pcStack_18->allocptr).proxyuserpwd);
      (pcStack_18->allocptr).proxyuserpwd = (char *)0x0;
      (pcStack_18->allocptr).proxyuserpwd = (char *)0x0;
      *(undefined1 *)&k[0x40].maxdownload = 1;
      Curl_infof((Curl_easy *)k,"Proxy replied OK to CONNECT request\n");
      *(undefined1 *)((long)&k[1].str_start + 1) = 0;
      (pcStack_18->bits).rewindaftersend = false;
      conn_local._4_4_ = CURLE_OK;
    }
    else {
      if (((check._7_1_ & 1) == 0) || (k[1].p == (char *)0x0)) {
        (*Curl_cfree)(k[1].p);
        k[1].p = (char *)0x0;
        Curl_conncontrol(pcStack_18,2);
        Curl_closesocket(pcStack_18,pcStack_18->sock[hostname_local._4_4_]);
        pcStack_18->sock[hostname_local._4_4_] = -1;
      }
      else {
        (pcStack_18->bits).proxy_connect_closed = true;
        Curl_infof((Curl_easy *)k,"Connect me again please\n");
      }
      pcStack_18->tunnel_state[hostname_local._4_4_] = TUNNEL_INIT;
      if (((pcStack_18->bits).proxy_connect_closed & 1U) == 0) {
        Curl_failf((Curl_easy *)k,"Received HTTP code %d from proxy after CONNECT",
                   (ulong)(uint)k[1].start.tv_sec);
        conn_local._4_4_ = CURLE_RECV_ERROR;
      }
      else {
        conn_local._4_4_ = CURLE_OK;
      }
    }
  }
  return conn_local._4_4_;
}

Assistant:

static CURLcode CONNECT(struct connectdata *conn,
                        int sockindex,
                        const char *hostname,
                        int remote_port)
{
  int subversion=0;
  struct Curl_easy *data=conn->data;
  struct SingleRequest *k = &data->req;
  CURLcode result;
  curl_socket_t tunnelsocket = conn->sock[sockindex];
  curl_off_t cl=0;
  bool closeConnection = FALSE;
  bool chunked_encoding = FALSE;
  time_t check;

#define SELECT_OK      0
#define SELECT_ERROR   1
#define SELECT_TIMEOUT 2
  int error = SELECT_OK;

  if(conn->tunnel_state[sockindex] == TUNNEL_COMPLETE)
    return CURLE_OK; /* CONNECT is already completed */

  conn->bits.proxy_connect_closed = FALSE;

  do {
    if(TUNNEL_INIT == conn->tunnel_state[sockindex]) {
      /* BEGIN CONNECT PHASE */
      char *host_port;
      Curl_send_buffer *req_buffer;

      infof(data, "Establish HTTP proxy tunnel to %s:%hu\n",
            hostname, remote_port);

        /* This only happens if we've looped here due to authentication
           reasons, and we don't really use the newly cloned URL here
           then. Just free() it. */
      free(data->req.newurl);
      data->req.newurl = NULL;

      /* initialize a dynamic send-buffer */
      req_buffer = Curl_add_buffer_init();

      if(!req_buffer)
        return CURLE_OUT_OF_MEMORY;

      host_port = aprintf("%s:%hu", hostname, remote_port);
      if(!host_port) {
        Curl_add_buffer_free(req_buffer);
        return CURLE_OUT_OF_MEMORY;
      }

      /* Setup the proxy-authorization header, if any */
      result = Curl_http_output_auth(conn, "CONNECT", host_port, TRUE);

      free(host_port);

      if(!result) {
        char *host = NULL;
        const char *proxyconn="";
        const char *useragent="";
        const char *http = (conn->http_proxy.proxytype == CURLPROXY_HTTP_1_0) ?
          "1.0" : "1.1";
        bool ipv6_ip = conn->bits.ipv6_ip;
        char *hostheader;

        /* the hostname may be different */
        if(hostname != conn->host.name)
          ipv6_ip = (strchr(hostname, ':') != NULL);
        hostheader= /* host:port with IPv6 support */
          aprintf("%s%s%s:%hu", ipv6_ip?"[":"", hostname, ipv6_ip?"]":"",
                  remote_port);
        if(!hostheader) {
          Curl_add_buffer_free(req_buffer);
          return CURLE_OUT_OF_MEMORY;
        }

        if(!Curl_checkProxyheaders(conn, "Host:")) {
          host = aprintf("Host: %s\r\n", hostheader);
          if(!host) {
            free(hostheader);
            Curl_add_buffer_free(req_buffer);
            return CURLE_OUT_OF_MEMORY;
          }
        }
        if(!Curl_checkProxyheaders(conn, "Proxy-Connection:"))
          proxyconn = "Proxy-Connection: Keep-Alive\r\n";

        if(!Curl_checkProxyheaders(conn, "User-Agent:") &&
           data->set.str[STRING_USERAGENT])
          useragent = conn->allocptr.uagent;

        result =
          Curl_add_bufferf(req_buffer,
                           "CONNECT %s HTTP/%s\r\n"
                           "%s"  /* Host: */
                           "%s"  /* Proxy-Authorization */
                           "%s"  /* User-Agent */
                           "%s", /* Proxy-Connection */
                           hostheader,
                           http,
                           host?host:"",
                           conn->allocptr.proxyuserpwd?
                           conn->allocptr.proxyuserpwd:"",
                           useragent,
                           proxyconn);

        if(host)
          free(host);
        free(hostheader);

        if(!result)
          result = Curl_add_custom_headers(conn, TRUE, req_buffer);

        if(!result)
          /* CRLF terminate the request */
          result = Curl_add_bufferf(req_buffer, "\r\n");

        if(!result) {
          /* Send the connect request to the proxy */
          /* BLOCKING */
          result =
            Curl_add_buffer_send(req_buffer, conn,
                                 &data->info.request_size, 0, sockindex);
        }
        req_buffer = NULL;
        if(result)
          failf(data, "Failed sending CONNECT to proxy");
      }

      Curl_add_buffer_free(req_buffer);
      if(result)
        return result;

      conn->tunnel_state[sockindex] = TUNNEL_CONNECT;
    } /* END CONNECT PHASE */

    check = Curl_timeleft(data, NULL, TRUE);
    if(check <= 0) {
      failf(data, "Proxy CONNECT aborted due to timeout");
      return CURLE_RECV_ERROR;
    }

    if(!Curl_conn_data_pending(conn, sockindex))
      /* return so we'll be called again polling-style */
      return CURLE_OK;
    DEBUGF(infof(data, "Read response immediately from proxy CONNECT\n"));

    /* at this point, the tunnel_connecting phase is over. */

    { /* READING RESPONSE PHASE */
      size_t nread;   /* total size read */
      int perline; /* count bytes per line */
      int keepon=TRUE;
      ssize_t gotbytes;
      char *ptr;
      char *line_start;

      ptr = conn->connect_buffer;
      line_start = ptr;

      nread = 0;
      perline = 0;

      while(nread < (size_t)CONNECT_BUFFER_SIZE && keepon && !error) {
        if(Curl_pgrsUpdate(conn))
          return CURLE_ABORTED_BY_CALLBACK;

        if(ptr >= &conn->connect_buffer[CONNECT_BUFFER_SIZE]) {
          failf(data, "CONNECT response too large!");
          return CURLE_RECV_ERROR;
        }

        check = Curl_timeleft(data, NULL, TRUE);
        if(check <= 0) {
          failf(data, "Proxy CONNECT aborted due to timeout");
          error = SELECT_TIMEOUT; /* already too little time */
          break;
        }

        /* Read one byte at a time to avoid a race condition. Wait at most one
           second before looping to ensure continuous pgrsUpdates. */
        result = Curl_read(conn, tunnelsocket, ptr, 1, &gotbytes);
        if(result == CURLE_AGAIN) {
          if(SOCKET_READABLE(tunnelsocket, check<1000L?check:1000) == -1) {
            error = SELECT_ERROR;
            failf(data, "Proxy CONNECT aborted due to select/poll error");
            break;
          }
          continue;
        }
        if(result) {
          keepon = FALSE;
          break;
        }
        else if(gotbytes <= 0) {
          if(data->set.proxyauth && data->state.authproxy.avail) {
            /* proxy auth was requested and there was proxy auth available,
               then deem this as "mere" proxy disconnect */
            conn->bits.proxy_connect_closed = TRUE;
            infof(data, "Proxy CONNECT connection closed\n");
          }
          else {
            error = SELECT_ERROR;
            failf(data, "Proxy CONNECT aborted");
          }
          keepon = FALSE;
          break;
        }

        /* We got a byte of data */
        nread++;

        if(keepon > TRUE) {
          /* This means we are currently ignoring a response-body */

          nread = 0; /* make next read start over in the read buffer */
          ptr = conn->connect_buffer;
          if(cl) {
            /* A Content-Length based body: simply count down the counter
               and make sure to break out of the loop when we're done! */
            cl--;
            if(cl <= 0) {
              keepon = FALSE;
              break;
            }
          }
          else {
            /* chunked-encoded body, so we need to do the chunked dance
               properly to know when the end of the body is reached */
            CHUNKcode r;
            ssize_t tookcareof = 0;

            /* now parse the chunked piece of data so that we can
               properly tell when the stream ends */
            r = Curl_httpchunk_read(conn, ptr, 1, &tookcareof);
            if(r == CHUNKE_STOP) {
              /* we're done reading chunks! */
              infof(data, "chunk reading DONE\n");
              keepon = FALSE;
              /* we did the full CONNECT treatment, go COMPLETE */
              conn->tunnel_state[sockindex] = TUNNEL_COMPLETE;
            }
          }
          continue;
        }

        perline++; /* amount of bytes in this line so far */

        /* if this is not the end of a header line then continue */
        if(*ptr != 0x0a) {
          ptr++;
          continue;
        }

        /* convert from the network encoding */
        result = Curl_convert_from_network(data, line_start, perline);
        /* Curl_convert_from_network calls failf if unsuccessful */
        if(result)
          return result;

        /* output debug if that is requested */
        if(data->set.verbose)
          Curl_debug(data, CURLINFO_HEADER_IN,
                     line_start, (size_t)perline, conn);

        if(!data->set.suppress_connect_headers) {
          /* send the header to the callback */
          int writetype = CLIENTWRITE_HEADER;
          if(data->set.include_header)
            writetype |= CLIENTWRITE_BODY;

          result = Curl_client_write(conn, writetype, line_start, perline);
          if(result)
            return result;
        }

        data->info.header_size += (long)perline;
        data->req.headerbytecount += (long)perline;

        /* Newlines are CRLF, so the CR is ignored as the line isn't
           really terminated until the LF comes. Treat a following CR
           as end-of-headers as well.*/

        if(('\r' == line_start[0]) ||
           ('\n' == line_start[0])) {
          /* end of response-headers from the proxy */
          nread = 0; /* make next read start over in the read
                        buffer */
          ptr = conn->connect_buffer;
          if((407 == k->httpcode) && !data->state.authproblem) {
            /* If we get a 407 response code with content length
               when we have no auth problem, we must ignore the
               whole response-body */
            keepon = 2;

            if(cl) {
              infof(data, "Ignore %" CURL_FORMAT_CURL_OFF_T
                    " bytes of response-body\n", cl);
            }
            else if(chunked_encoding) {
              CHUNKcode r;

              infof(data, "Ignore chunked response-body\n");

              /* We set ignorebody true here since the chunked
                 decoder function will acknowledge that. Pay
                 attention so that this is cleared again when this
                 function returns! */
              k->ignorebody = TRUE;

              if(line_start[1] == '\n') {
                /* this can only be a LF if the letter at index 0
                   was a CR */
                line_start++;
              }

              /* now parse the chunked piece of data so that we can
                 properly tell when the stream ends */
              r = Curl_httpchunk_read(conn, line_start + 1, 1, &gotbytes);
              if(r == CHUNKE_STOP) {
                /* we're done reading chunks! */
                infof(data, "chunk reading DONE\n");
                keepon = FALSE;
                /* we did the full CONNECT treatment, go to
                   COMPLETE */
                conn->tunnel_state[sockindex] = TUNNEL_COMPLETE;
              }
            }
            else {
              /* without content-length or chunked encoding, we
                 can't keep the connection alive since the close is
                 the end signal so we bail out at once instead */
              keepon = FALSE;
            }
          }
          else
            keepon = FALSE;
          /* we did the full CONNECT treatment, go to COMPLETE */
          conn->tunnel_state[sockindex] = TUNNEL_COMPLETE;
          continue;
        }

        line_start[perline] = 0; /* zero terminate the buffer */
        if((checkprefix("WWW-Authenticate:", line_start) &&
            (401 == k->httpcode)) ||
           (checkprefix("Proxy-authenticate:", line_start) &&
            (407 == k->httpcode))) {

          bool proxy = (k->httpcode == 407) ? TRUE : FALSE;
          char *auth = Curl_copy_header_value(line_start);
          if(!auth)
            return CURLE_OUT_OF_MEMORY;

          result = Curl_http_input_auth(conn, proxy, auth);

          free(auth);

          if(result)
            return result;
        }
        else if(checkprefix("Content-Length:", line_start)) {
          if(k->httpcode/100 == 2) {
            /* A client MUST ignore any Content-Length or Transfer-Encoding
               header fields received in a successful response to CONNECT.
               "Successful" described as: 2xx (Successful). RFC 7231 4.3.6 */
            infof(data, "Ignoring Content-Length in CONNECT %03d response\n",
                  k->httpcode);
          }
          else {
            cl = curlx_strtoofft(line_start +
                                 strlen("Content-Length:"), NULL, 10);
          }
        }
        else if(Curl_compareheader(line_start, "Connection:", "close"))
          closeConnection = TRUE;
        else if(checkprefix("Transfer-Encoding:", line_start)) {
          if(k->httpcode/100 == 2) {
            /* A client MUST ignore any Content-Length or Transfer-Encoding
               header fields received in a successful response to CONNECT.
               "Successful" described as: 2xx (Successful). RFC 7231 4.3.6 */
            infof(data, "Ignoring Transfer-Encoding in "
                  "CONNECT %03d response\n", k->httpcode);
          }
          else if(Curl_compareheader(line_start,
                                     "Transfer-Encoding:", "chunked")) {
            infof(data, "CONNECT responded chunked\n");
            chunked_encoding = TRUE;
            /* init our chunky engine */
            Curl_httpchunk_init(conn);
          }
        }
        else if(Curl_compareheader(line_start, "Proxy-Connection:", "close"))
          closeConnection = TRUE;
        else if(2 == sscanf(line_start, "HTTP/1.%d %d",
                            &subversion,
                            &k->httpcode)) {
          /* store the HTTP code from the proxy */
          data->info.httpproxycode = k->httpcode;
        }

        perline = 0; /* line starts over here */
        ptr = conn->connect_buffer;
        line_start = ptr;
      } /* while there's buffer left and loop is requested */

      if(Curl_pgrsUpdate(conn))
        return CURLE_ABORTED_BY_CALLBACK;

      if(error)
        return CURLE_RECV_ERROR;

      if(data->info.httpproxycode != 200) {
        /* Deal with the possibly already received authenticate
           headers. 'newurl' is set to a new URL if we must loop. */
        result = Curl_http_auth_act(conn);
        if(result)
          return result;

        if(conn->bits.close)
          /* the connection has been marked for closure, most likely in the
             Curl_http_auth_act() function and thus we can kill it at once
             below */
          closeConnection = TRUE;
      }

      if(closeConnection && data->req.newurl) {
        /* Connection closed by server. Don't use it anymore */
        Curl_closesocket(conn, conn->sock[sockindex]);
        conn->sock[sockindex] = CURL_SOCKET_BAD;
        break;
      }
    } /* END READING RESPONSE PHASE */

    /* If we are supposed to continue and request a new URL, which basically
     * means the HTTP authentication is still going on so if the tunnel
     * is complete we start over in INIT state */
    if(data->req.newurl &&
       (TUNNEL_COMPLETE == conn->tunnel_state[sockindex])) {
      conn->tunnel_state[sockindex] = TUNNEL_INIT;
      infof(data, "TUNNEL_STATE switched to: %d\n",
            conn->tunnel_state[sockindex]);
    }

  } while(data->req.newurl);

  if(200 != data->req.httpcode) {
    if(closeConnection && data->req.newurl) {
      conn->bits.proxy_connect_closed = TRUE;
      infof(data, "Connect me again please\n");
    }
    else {
      free(data->req.newurl);
      data->req.newurl = NULL;
      /* failure, close this connection to avoid re-use */
      streamclose(conn, "proxy CONNECT failure");
      Curl_closesocket(conn, conn->sock[sockindex]);
      conn->sock[sockindex] = CURL_SOCKET_BAD;
    }

    /* to back to init state */
    conn->tunnel_state[sockindex] = TUNNEL_INIT;

    if(conn->bits.proxy_connect_closed)
      /* this is not an error, just part of the connection negotiation */
      return CURLE_OK;
    failf(data, "Received HTTP code %d from proxy after CONNECT",
          data->req.httpcode);
    return CURLE_RECV_ERROR;
  }

  conn->tunnel_state[sockindex] = TUNNEL_COMPLETE;

  /* If a proxy-authorization header was used for the proxy, then we should
     make sure that it isn't accidentally used for the document request
     after we've connected. So let's free and clear it here. */
  Curl_safefree(conn->allocptr.proxyuserpwd);
  conn->allocptr.proxyuserpwd = NULL;

  data->state.authproxy.done = TRUE;

  infof(data, "Proxy replied OK to CONNECT request\n");
  data->req.ignorebody = FALSE; /* put it (back) to non-ignore state */
  conn->bits.rewindaftersend = FALSE; /* make sure this isn't set for the
                                         document request  */
  return CURLE_OK;
}